

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__is_16_main(stbi__context *s)

{
  int iVar1;
  stbi__context *s_local;
  
  iVar1 = stbi__png_is16(s);
  if (iVar1 == 0) {
    iVar1 = stbi__psd_is16(s);
    if (iVar1 == 0) {
      s_local._4_4_ = 0;
    }
    else {
      s_local._4_4_ = 1;
    }
  }
  else {
    s_local._4_4_ = 1;
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__is_16_main(stbi__context *s)
{
   #ifndef STBI_NO_PNG
   if (stbi__png_is16(s))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_is16(s))  return 1;
   #endif

   return 0;
}